

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O0

void __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_>::CalcResidualInternal<double>
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *this,
          TPZElementMatrixT<double> *ef)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  TPZGeoEl *pTVar7;
  ostream *poVar8;
  long *plVar9;
  long in_RSI;
  long *in_RDI;
  int i_sh;
  int status;
  TPZFNMatrix<9,_double> rhsCopy;
  int i_st;
  TPZFNMatrix<10,_double> rhsTemp;
  TPZFNMatrix<90,_double> ekCopy;
  int i;
  int nsolvars;
  int variableindex;
  int var_ind;
  int n_var_indexes;
  int64_t index;
  int int_ind;
  TPZVec<double> Sol;
  int stackedVarSize;
  TPZManVector<int,_10> varIndex;
  TPZFNMatrix<10,_double> ekTemp;
  int nshape;
  int intrulepointsRef;
  int intrulepoints;
  TPZIntPoints *intruleRef;
  TPZIntPoints *intrule;
  TPZIntPoints *pFIntegrationRule;
  REAL weightRef;
  REAL weight;
  TPZManVector<double,_3> intpointRef;
  TPZManVector<double,_3> intpoint;
  int dim;
  TPZMaterialDataT<double> dataRef;
  TPZMaterialDataT<double> data;
  TPZFNMatrix<1,_double> efTemp;
  int64_t numeq;
  TPZMatSingleSpaceT<double> *pMaterialRef;
  TPZPostProcMat *pPostProcMat;
  TPZMultiphysicsElement *pMultiRef;
  TPZInterpolationSpace *pIntSpRef;
  TPZCompEl *pCompElRef;
  TPZMaterialDataT<double> *in_stack_fffffffffffef200;
  TPZCompMesh *in_stack_fffffffffffef208;
  TPZElementMatrixT<double> *in_stack_fffffffffffef210;
  undefined4 in_stack_fffffffffffef218;
  undefined4 in_stack_fffffffffffef21c;
  TPZPostProcMat *in_stack_fffffffffffef220;
  TPZFMatrix<double> *in_stack_fffffffffffef228;
  TPZMaterialDataT<double> *in_stack_fffffffffffef230;
  double *in_stack_fffffffffffef238;
  undefined4 in_stack_fffffffffffef240;
  int in_stack_fffffffffffef244;
  TPZFMatrix<double> *in_stack_fffffffffffef250;
  int64_t in_stack_fffffffffffef258;
  TPZManVector<double,_10> *in_stack_fffffffffffef260;
  int64_t in_stack_fffffffffffef270;
  TPZMatrix<double> *in_stack_fffffffffffef278;
  long *plStack_10d38;
  long *plStack_10d28;
  long *plStack_10d18;
  long *plStack_10d08;
  int iStack_10cf0;
  int iStack_10c04;
  TPZFMatrix<double> aTStack_10bf8 [3];
  size_t in_stack_fffffffffffef618;
  char *in_stack_fffffffffffef620;
  int iStack_107a4;
  int iStack_10798;
  long lStack_10790;
  undefined8 uStack_10788;
  int iStack_1077c;
  TPZVec<double> TStack_10778;
  int iStack_10754;
  TPZVec<int> aTStack_10750 [2];
  undefined8 uStack_10708;
  undefined1 auStack_10700 [232];
  int iStack_10618;
  undefined4 uStack_10614;
  int iStack_10610;
  int iStack_1060c;
  long *plStack_10608;
  long *plStack_10600;
  long lStack_105f8;
  double dStack_105f0;
  double adStack_105e8 [2];
  undefined1 auStack_105d8 [56];
  undefined8 uStack_105a0;
  undefined1 auStack_10598 [60];
  undefined4 uStack_1055c;
  undefined1 auStack_10558 [14584];
  undefined1 local_cc60;
  undefined4 local_c2f0;
  double local_c2e0;
  int local_bc98;
  undefined1 local_8318 [17000];
  undefined4 local_40b0;
  double local_40a0;
  int local_3a58;
  TPZVec<TPZManVector<double,_10>_> local_3a48 [459];
  undefined8 local_e8;
  undefined1 local_e0 [160];
  int64_t local_40;
  long *local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  TPZCompEl *local_18;
  long local_10;
  
  local_10 = in_RSI;
  TPZElementMatrixT<double>::Reset
            (in_stack_fffffffffffef210,in_stack_fffffffffffef208,
             (MType)((ulong)in_stack_fffffffffffef200 >> 0x20));
  (**(code **)(*in_RDI + 0x100))(in_RDI,local_10);
  local_18 = ReferredElement((TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *)
                             in_stack_fffffffffffef200);
  if (local_18 == (TPZCompEl *)0x0) {
    plStack_10d08 = (long *)0x0;
  }
  else {
    plStack_10d08 =
         (long *)__dynamic_cast(local_18,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
  }
  local_20 = plStack_10d08;
  if (local_18 == (TPZCompEl *)0x0) {
    plStack_10d18 = (long *)0x0;
  }
  else {
    plStack_10d18 =
         (long *)__dynamic_cast(local_18,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
  }
  local_28 = plStack_10d18;
  lVar6 = (**(code **)(*in_RDI + 0xb8))();
  if (lVar6 == 0) {
    plStack_10d28 = (long *)0x0;
  }
  else {
    plStack_10d28 = (long *)__dynamic_cast(lVar6,&TPZMaterial::typeinfo,&TPZPostProcMat::typeinfo,0)
    ;
  }
  local_30 = plStack_10d28;
  if (plStack_10d28 == (long *)0x0) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffef620,in_stack_fffffffffffef618);
  }
  lVar6 = (**(code **)(*(long *)local_18 + 0xb8))();
  if (lVar6 == 0) {
    plStack_10d38 = (long *)0x0;
  }
  else {
    plStack_10d38 =
         (long *)__dynamic_cast(lVar6,&TPZMaterial::typeinfo,&TPZMatSingleSpaceT<double>::typeinfo,
                                0xfffffffffffffffe);
  }
  local_38 = plStack_10d38;
  iVar2 = (**(code **)(*in_RDI + 0x90))();
  if (iVar2 != 0) {
    local_40 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(local_10 + 0x1f0));
    local_e8 = 0;
    TPZFNMatrix<1,_double>::TPZFNMatrix
              ((TPZFNMatrix<1,_double> *)
               CONCAT44(in_stack_fffffffffffef244,in_stack_fffffffffffef240),
               (int64_t)in_stack_fffffffffffef238,(int64_t)in_stack_fffffffffffef230,
               (double *)in_stack_fffffffffffef228);
    TPZMaterialDataT<double>::TPZMaterialDataT(in_stack_fffffffffffef230);
    TPZMaterialDataT<double>::TPZMaterialDataT(in_stack_fffffffffffef230);
    (**(code **)(*in_RDI + 0x298))(in_RDI,local_8318);
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 0x298))(local_20,auStack_10558);
      local_cc60 = 1;
      local_c2f0 = (**(code **)(*local_20 + 0x268))();
    }
    local_40b0 = (**(code **)(*in_RDI + 0x268))();
    pTVar7 = TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffef208);
    uStack_1055c = (**(code **)(*(long *)pTVar7 + 0x210))();
    uStack_105a0 = 0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffef230,
               (int64_t)in_stack_fffffffffffef228,(double *)in_stack_fffffffffffef220);
    adStack_105e8[1] = 0.0;
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffef230,
               (int64_t)in_stack_fffffffffffef228,(double *)in_stack_fffffffffffef220);
    adStack_105e8[0] = 0.0;
    dStack_105f0 = 0.0;
    lStack_105f8 = (**(code **)(*in_RDI + 0x2c8))();
    if (lStack_105f8 == 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error at ");
      poVar8 = std::operator<<(poVar8,
                               "void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>>::CalcResidualInternal(TPZElementMatrixT<TVar> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapePoint>, TVar = double]"
                              );
      std::operator<<(poVar8," Integration rule must be used from TPZCompEl. \n");
      pzinternal::DebugStopImpl(in_stack_fffffffffffef620,in_stack_fffffffffffef618);
    }
    plStack_10600 = (long *)(**(code **)(*in_RDI + 0x2c8))();
    plStack_10608 = (long *)(**(code **)(*(long *)local_18 + 0x240))();
    iStack_1060c = (**(code **)(*plStack_10600 + 0x18))();
    iStack_10610 = (**(code **)(*plStack_10608 + 0x18))();
    if (iStack_1060c == iStack_10610) {
      iVar2 = (**(code **)(*in_RDI + 600))();
      uStack_10708 = 0;
      iStack_10618 = iVar2;
      TPZFNMatrix<10,_double>::TPZFNMatrix
                ((TPZFNMatrix<10,_double> *)
                 CONCAT44(in_stack_fffffffffffef244,in_stack_fffffffffffef240),
                 (int64_t)in_stack_fffffffffffef238,(int64_t)in_stack_fffffffffffef230,
                 (double *)in_stack_fffffffffffef228);
      TPZManVector<int,_10>::TPZManVector
                ((TPZManVector<int,_10> *)in_stack_fffffffffffef220,
                 CONCAT44(in_stack_fffffffffffef21c,in_stack_fffffffffffef218));
      TPZPostProcMat::GetPostProcessVarIndexList
                (in_stack_fffffffffffef220,
                 (TPZVec<int> *)CONCAT44(in_stack_fffffffffffef21c,in_stack_fffffffffffef218));
      iVar3 = (**(code **)(*local_30 + 0x78))();
      iStack_10754 = iVar3;
      TPZVec<double>::TPZVec(&TStack_10778);
      for (iStack_1077c = 0; iStack_1077c < iStack_1060c; iStack_1077c = iStack_1077c + 1) {
        (**(code **)(*plStack_10600 + 0x20))(plStack_10600,iStack_1077c,auStack_10598,adStack_105e8)
        ;
        (**(code **)(*plStack_10608 + 0x20))(plStack_10608,iStack_1077c,auStack_105d8,&dStack_105f0)
        ;
        local_3a58 = iStack_1077c;
        local_bc98 = iStack_1077c;
        (**(code **)(*in_RDI + 0x2a8))(in_RDI,local_8318,auStack_10598);
        local_bc98 = iStack_1077c;
        if (local_20 != (long *)0x0) {
          (**(code **)(*local_20 + 0x290))(local_20,auStack_105d8,auStack_10558);
          (**(code **)(*local_20 + 0x2a8))(local_20,auStack_10558,auStack_105d8);
        }
        if (local_28 != (long *)0x0) {
          (**(code **)(*local_28 + 0x2c8))(local_28,auStack_10558,auStack_105d8);
        }
        adStack_105e8[0] = adStack_105e8[0] * ABS(local_40a0);
        dStack_105f0 = dStack_105f0 * ABS(local_c2e0);
        in_stack_fffffffffffef260 = TPZVec<TPZManVector<double,_10>_>::operator[](local_3a48,0);
        uStack_10788 = 0;
        (*(in_stack_fffffffffffef260->super_TPZVec<double>)._vptr_TPZVec[2])
                  (in_stack_fffffffffffef260,(long)iStack_10754,&uStack_10788);
        lStack_10790 = 0;
        in_stack_fffffffffffef258 = TPZVec<int>::NElements(aTStack_10750);
        iVar5 = (int)in_stack_fffffffffffef258;
        for (iStack_10798 = 0; iStack_10798 < iVar5; iStack_10798 = iStack_10798 + 1) {
          in_stack_fffffffffffef250 =
               (TPZFMatrix<double> *)TPZVec<int>::operator[](aTStack_10750,(long)iStack_10798);
          iVar1 = *(int *)&(in_stack_fffffffffffef250->super_TPZMatrix<double>).super_TPZBaseMatrix.
                           super_TPZSavable._vptr_TPZSavable;
          plVar9 = (long *)(**(code **)(*(long *)local_18 + 0xb8))();
          iVar4 = (**(code **)(*plVar9 + 0x88))(plVar9,iVar1);
          in_stack_fffffffffffef244 = iVar4;
          TPZVec<double>::Resize
                    ((TPZVec<double> *)in_stack_fffffffffffef230,(int64_t)in_stack_fffffffffffef228)
          ;
          if (iVar1 < 99) {
            (**(code **)(*local_38 + 0x88))(local_38,auStack_10558,iVar1,&TStack_10778);
          }
          else {
            (**(code **)(*(long *)local_18 + 0x1b0))(local_18,auStack_105d8,iVar1,&TStack_10778);
          }
          for (iStack_107a4 = 0; iStack_107a4 < iVar4; iStack_107a4 = iStack_107a4 + 1) {
            in_stack_fffffffffffef238 = TPZVec<double>::operator[](&TStack_10778,(long)iStack_107a4)
            ;
            in_stack_fffffffffffef228 = (TPZFMatrix<double> *)*in_stack_fffffffffffef238;
            in_stack_fffffffffffef230 =
                 (TPZMaterialDataT<double> *)
                 TPZVec<TPZManVector<double,_10>_>::operator[](local_3a48,0);
            in_stack_fffffffffffef220 =
                 (TPZPostProcMat *)
                 TPZVec<double>::operator[]
                           ((TPZVec<double> *)in_stack_fffffffffffef230,lStack_10790 + iStack_107a4)
            ;
            *(TPZFMatrix<double> **)
             &(in_stack_fffffffffffef220->
              super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
              ).super_TPZMaterialT<double>.super_TPZMaterial = in_stack_fffffffffffef228;
          }
          lStack_10790 = iVar4 + lStack_10790;
        }
        (**(code **)(*local_30 + 200))(adStack_105e8[0],local_30,local_8318,auStack_10700,local_e0);
      }
      TPZFNMatrix<90,_double>::TPZFNMatrix
                ((TPZFNMatrix<90,_double> *)in_stack_fffffffffffef230,in_stack_fffffffffffef228);
      TPZFNMatrix<10,_double>::TPZFNMatrix
                ((TPZFNMatrix<10,_double> *)
                 CONCAT44(in_stack_fffffffffffef244,in_stack_fffffffffffef240),
                 (int64_t)in_stack_fffffffffffef238,(int64_t)in_stack_fffffffffffef230,
                 (double *)in_stack_fffffffffffef228);
      for (iStack_10c04 = 0; iStack_10c04 < iStack_10754; iStack_10c04 = iStack_10c04 + 1) {
        TPZMatrix<double>::GetSub
                  (in_stack_fffffffffffef278,in_stack_fffffffffffef270,CONCAT44(iVar2,iVar3),
                   (int64_t)in_stack_fffffffffffef260,in_stack_fffffffffffef258,
                   in_stack_fffffffffffef250);
        TPZFNMatrix<9,_double>::TPZFNMatrix
                  ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffef230,in_stack_fffffffffffef228);
        iVar5 = TPZMatrix<double>::Solve_LU
                          ((TPZMatrix<double> *)in_stack_fffffffffffef210,
                           (TPZFMatrix<double> *)in_stack_fffffffffffef208);
        for (iStack_10cf0 = 0; iStack_10cf0 < iStack_10618; iStack_10cf0 = iStack_10cf0 + 1) {
          in_stack_fffffffffffef210 =
               (TPZElementMatrixT<double> *)
               TPZFMatrix<double>::operator()(aTStack_10bf8,(long)iStack_10cf0);
          in_stack_fffffffffffef200 =
               (TPZMaterialDataT<double> *)
               (in_stack_fffffffffffef210->super_TPZElementMatrix)._vptr_TPZElementMatrix;
          in_stack_fffffffffffef208 =
               (TPZCompMesh *)
               TPZFMatrix<double>::operator()
                         ((TPZFMatrix<double> *)in_stack_fffffffffffef220,
                          CONCAT44(iVar5,in_stack_fffffffffffef218),
                          (int64_t)in_stack_fffffffffffef210);
          *(TPZMaterialDataT<double> **)in_stack_fffffffffffef208 = in_stack_fffffffffffef200;
        }
        TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1ca1083);
      }
      TPZFNMatrix<10,_double>::~TPZFNMatrix((TPZFNMatrix<10,_double> *)0x1ca10a6);
      TPZFNMatrix<90,_double>::~TPZFNMatrix((TPZFNMatrix<90,_double> *)0x1ca10b3);
      TPZVec<double>::~TPZVec((TPZVec<double> *)in_stack_fffffffffffef200);
      TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffef200);
      TPZFNMatrix<10,_double>::~TPZFNMatrix((TPZFNMatrix<10,_double> *)0x1ca10da);
      uStack_10614 = 0;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"Error at ");
      poVar8 = std::operator<<(poVar8,
                               "void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>>::CalcResidualInternal(TPZElementMatrixT<TVar> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapePoint>, TVar = double]"
                              );
      std::operator<<(poVar8," Referred CompEl with different number of integration points\n");
      uStack_10614 = 1;
    }
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffef200);
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffef200);
    TPZMaterialDataT<double>::~TPZMaterialDataT(in_stack_fffffffffffef200);
    TPZMaterialDataT<double>::~TPZMaterialDataT(in_stack_fffffffffffef200);
    TPZFNMatrix<1,_double>::~TPZFNMatrix((TPZFNMatrix<1,_double> *)0x1ca1126);
  }
  return;
}

Assistant:

inline void TPZCompElPostProc<TCOMPEL>::CalcResidualInternal(TPZElementMatrixT<TVar> &ef)
{
    ef.Reset();
    
    this->InitializeElementMatrix(ef);
    
    TPZCompEl * pCompElRef = ReferredElement();
    
    TPZInterpolationSpace * pIntSpRef = dynamic_cast<TPZInterpolationSpace *>(pCompElRef);
    
    TPZMultiphysicsElement *pMultiRef = dynamic_cast<TPZMultiphysicsElement *>(pCompElRef);
    
    TPZPostProcMat * pPostProcMat = dynamic_cast<TPZPostProcMat *>(this->Material());
    
    if(!pPostProcMat) DebugStop();
    
    auto* pMaterialRef =
        dynamic_cast<TPZMatSingleSpaceT<STATE>*>(pCompElRef->Material());
    
    
    if (this->NConnects() == 0) return;///boundary discontinuous elements have this characteristic
    
    int64_t numeq = ef.fMat.Rows();
    TPZFNMatrix<1,STATE> efTemp(numeq,1,0.);
    
    TPZMaterialDataT<STATE> data, dataRef;
    this->InitMaterialData(data);
    if(pIntSpRef)
    {
        pIntSpRef->InitMaterialData(dataRef);
        dataRef.fNeedsSol = true;
        dataRef.p = pIntSpRef->MaxOrder();
    }
    data.p    = this->MaxOrder();
    int dim = this->Reference()->Dimension();
    TPZManVector<REAL,3> intpoint(dim,0.);
    TPZManVector<REAL,3> intpointRef(dim,0);
    REAL weight = 0.;
    REAL weightRef = 0;
  
    TPZIntPoints* pFIntegrationRule = &this->GetIntegrationRule();
    if (!pFIntegrationRule) {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " Integration rule must be used from TPZCompEl. \n";
        DebugStop();
    }
    
    const TPZIntPoints &intrule    = this->GetIntegrationRule();
    const TPZIntPoints &intruleRef = pCompElRef->GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    int intrulepointsRef = intruleRef.NPoints();
    if(intrulepoints != intrulepointsRef)
    {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " Referred CompEl with different number of integration points\n";
        return;
    }
    
    int nshape = this->NShapeF();
    TPZFNMatrix<10,STATE> ekTemp(nshape, nshape, 0.);
    
    TPZManVector<int,10> varIndex;
    pPostProcMat->GetPostProcessVarIndexList(varIndex);
    
    int stackedVarSize = pPostProcMat->NStateVariables();
    TPZVec<STATE> Sol;
    
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule.   Point(int_ind,intpoint,   weight);
        intruleRef.Point(int_ind,intpointRef,weightRef);
        data   .intLocPtIndex = int_ind;
        dataRef.intLocPtIndex = int_ind;
        this->ComputeRequiredData(data,    intpoint);
        
        /*pIntSpRef ->ComputeShape(intpointRef, dataRef.x, dataRef.jacobian,
         dataRef.axes, dataRef.detjac, dataRef.jacinv,
         dataRef.phi, dataRef.dphix); */
        dataRef.intLocPtIndex = int_ind;
        if(pIntSpRef)
        {
            pIntSpRef->ComputeShape(intpointRef,dataRef);
            pIntSpRef->ComputeRequiredData(dataRef, intpointRef);
        }
        if(pMultiRef)
        {
            pMultiRef->ComputeRequiredData(dataRef, intpointRef);
        }
        weight    *= fabs(data.detjac);
        weightRef *= fabs(dataRef.detjac);
        
//        if(pIntSpRef)
//        {
//            if(!dataequal(data,dataRef)){
//                PZError << "Error at " << __PRETTY_FUNCTION__ << " this and Referred CompEl TPZMaterialData(s) do not match\n";
//                ef.Reset();
//                return;
//            }
//        }
        data.sol[0].Resize(stackedVarSize,0.);
        int64_t index = 0;
        // stacking the solutions to post process.
#ifdef PZ_LOG
        TPZLogger pzcompelpostproclogger("pz.mesh.TPZCompElPostProc");
        if(pzcompelpostproclogger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Integration point " << int_ind << " x = " << dataRef.x << " GradSol = " << dataRef.dsol[0] ;
            LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
        }
#endif
        int n_var_indexes = varIndex.NElements();
        for(int var_ind = 0; var_ind < n_var_indexes; var_ind++)
        {
            int variableindex = varIndex[var_ind];
            int nsolvars = pCompElRef->Material()->NSolutionVariables(variableindex);
            Sol.Resize(nsolvars);

            // diferenca entre variavel de interpolacao e variavel de elemento
            if (variableindex < 99) {
                pMaterialRef->Solution(dataRef, variableindex, Sol);
            }
            else {
                pCompElRef->Solution(intpointRef, variableindex, Sol);
            }

#ifdef PZ_LOG
            if(pzcompelpostproclogger.isDebugEnabled())
            {
                std::stringstream sout;
                std::string varname;
                pPostProcMat->GetPostProcVarName(var_ind, varname);
                sout << varname << " -value- " << Sol;
                LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
            }
#endif
            for(int i = 0; i <nsolvars; i++) data.sol[0][index+i] = Sol[i];
            index += nsolvars;
        }
        
        pPostProcMat->Contribute(data,weight,ekTemp,efTemp);
        
    }//loop over integration points
    
    TPZFNMatrix<90,STATE> ekCopy(ekTemp);
    
    TPZFNMatrix<10,STATE> rhsTemp(nshape, 1, 0.);
    for(int i_st = 0; i_st < stackedVarSize; i_st++)
    {
        
        efTemp.GetSub(i_st*nshape, 0, nshape, 1, rhsTemp);
        
        TPZFNMatrix<9,STATE> rhsCopy(rhsTemp);
//        int status = ekTemp.Solve_Cholesky(&(rhsTemp));
        int status = ekTemp.Solve_LU(&(rhsTemp));
#ifdef PZDEBUG
        {
            TPZFNMatrix<9,STATE> result(nshape,1,0.);
            ekCopy.MultAdd(rhsTemp, rhsCopy, result, 1., -1.);
            REAL invRes = Norm(result);
            if(!status ){
                PZError << "Error at " << __PRETTY_FUNCTION__ << " Unable to solve the transference linear system\n";
                ef.Reset();
                return;
            }
            
            if(invRes > 1.e-7)
            {
                PZError << "Error at " << __PRETTY_FUNCTION__
                << " Transference linear system solved with residual norm = "
                << invRes << " at " << i_st << " export variable\n";
            }
        }
#endif
        for(int i_sh = 0; i_sh < nshape; i_sh++)
            ef.fMat(i_sh * stackedVarSize + i_st, 0) = rhsTemp(i_sh);
    }

#ifdef PZ_LOG2
    {
        std::stringstream sout;
        sout << "Element index " << this->fIndex << std::endl;
        ef.fMat.Print("Post Processed ",sout);
        LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
    }
#endif
    
}